

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O1

void __thiscall
Refal2::CVariablesBuilder::errorTypesNotMatched
          (CVariablesBuilder *this,char name,TVariableType type)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13b432);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_c0 = *plVar2;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar2;
    local_d0 = (long *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (type - VT_S < 4) {
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
      local_90 = (long *)*plVar1;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar3 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70.field_2._8_8_ = plVar1[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_70._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    CErrorsHelper::RaiseError(&this->super_CErrorsHelper,ES_Error,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                ,0x10f,"const char *Refal2::convertVariableTypeToTag(TVariableType)");
}

Assistant:

void CVariablesBuilder::errorTypesNotMatched( char name, TVariableType type )
{
	error( "variable `" + std::string( 1, name )
		+ "` previously defined in rule with type `"
		+ convertVariableTypeToTag( type ) + "`" );
}